

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O2

void __thiscall Flasher::info(Flasher *this,FlasherInfo *info)

{
  Samba *pSVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  _Bvector_base<std::allocator<bool>_> _Stack_48;
  
  std::__cxx11::string::_M_assign((string *)&info->name);
  Samba::version_abi_cxx11_((string *)&_Stack_48,this->_samba);
  std::__cxx11::string::operator=((string *)&info->version,(string *)&_Stack_48);
  std::__cxx11::string::~string((string *)&_Stack_48);
  uVar2 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[2])();
  info->address = uVar2;
  uVar2 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4])();
  info->numPages = uVar2;
  uVar2 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  info->pageSize = uVar2;
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4])();
  iVar4 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  info->totalSize = iVar4 * iVar3;
  uVar2 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[5])();
  info->numPlanes = uVar2;
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[0xc])();
  info->security = SUB41(iVar3,0);
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[0x14])();
  info->bootFlash = SUB41(iVar3,0);
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[0xe])();
  info->bod = SUB41(iVar3,0);
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[0x11])();
  info->bor = SUB41(iVar3,0);
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[0x16])();
  info->canBootFlash = SUB41(iVar3,0);
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[0x10])();
  info->canBod = SUB41(iVar3,0);
  iVar3 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[0x13])();
  info->canBor = SUB41(iVar3,0);
  pSVar1 = this->_samba;
  info->canChipErase = pSVar1->_canChipErase;
  info->canWriteBuffer = pSVar1->_canWriteBuffer;
  info->canChecksumBuffer = pSVar1->_canChecksumBuffer;
  (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
     super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
     super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[10])(&_Stack_48);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&info->lockRegions,(vector<bool,_std::allocator<bool>_> *)&_Stack_48);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&_Stack_48);
  return;
}

Assistant:

void
Flasher::info(FlasherInfo& info)
{
    info.name = _flash->name();
    info.version = _samba.version();
    info.address = _flash->address();
    info.numPages = _flash->numPages();
    info.pageSize = _flash->pageSize();
    info.totalSize = _flash->numPages() * _flash->pageSize();
    info.numPlanes = _flash->numPlanes();
    info.security = _flash->getSecurity();
    info.bootFlash = _flash->getBootFlash();
    info.bod = _flash->getBod();
    info.bor = _flash->getBor();

    info.canBootFlash = _flash->canBootFlash();
    info.canBod = _flash->canBod();
    info.canBor = _flash->canBor();
    info.canChipErase = _samba.canChipErase();
    info.canWriteBuffer = _samba.canWriteBuffer();
    info.canChecksumBuffer = _samba.canChecksumBuffer();
    info.lockRegions = _flash->getLockRegions();
}